

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O2

void Msat_HeapPercolateUp(Msat_Order_t *p,int i)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  Msat_IntVec_t *pMVar6;
  
  piVar4 = p->vHeap->pArray;
  iVar2 = piVar4[i];
  while (1 < (uint)i) {
    pMVar6 = p->vIndex;
    pdVar5 = p->pSat->pdActivity;
    dVar1 = pdVar5[iVar2];
    iVar3 = piVar4[i >> 1];
    pdVar5 = pdVar5 + iVar3;
    if (dVar1 < *pdVar5 || dVar1 == *pdVar5) goto LAB_00754fc7;
    piVar4[i] = iVar3;
    pMVar6->pArray[iVar3] = i;
    i = i >> 1;
  }
  pMVar6 = p->vIndex;
LAB_00754fc7:
  piVar4[i] = iVar2;
  pMVar6->pArray[iVar2] = i;
  return;
}

Assistant:

void Msat_HeapPercolateUp( Msat_Order_t * p, int i )
{
    int x = HHEAP(p, i);
    while ( HPARENT(i) != 0 && HCOMPARE(p, x, HHEAP(p, HPARENT(i))) )
    {
        p->vHeap->pArray[i]            = HHEAP(p, HPARENT(i));
        p->vIndex->pArray[HHEAP(p, i)] = i;
        i                              = HPARENT(i);
    }
    p->vHeap->pArray[i]  = x;
    p->vIndex->pArray[x] = i;
}